

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

void Acb_NtkFindSupp_rec(Acb_Ntk_t *p,int iObj,Vec_Int_t *vSupp)

{
  int iVar1;
  int *piVar2;
  int local_30;
  int i;
  int iFanin;
  int *pFanin;
  Vec_Int_t *vSupp_local;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Acb_ObjSetTravIdCur(p,iObj);
  if (iVar1 == 0) {
    iVar1 = Acb_ObjIsCi(p,iObj);
    if (iVar1 == 0) {
      local_30 = 0;
      piVar2 = Acb_ObjFanins(p,iObj);
      for (; local_30 < *piVar2; local_30 = local_30 + 1) {
        Acb_NtkFindSupp_rec(p,piVar2[local_30 + 1],vSupp);
      }
    }
    else {
      iVar1 = Acb_ObjCioId(p,iObj);
      Vec_IntPush(vSupp,iVar1);
    }
  }
  return;
}

Assistant:

void Acb_NtkFindSupp_rec( Acb_Ntk_t * p, int iObj, Vec_Int_t * vSupp )
{
    int * pFanin, iFanin, i;
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    if ( Acb_ObjIsCi(p, iObj) )
        Vec_IntPush( vSupp, Acb_ObjCioId(p, iObj) );
    else
        Acb_ObjForEachFaninFast( p, iObj, pFanin, iFanin, i )
            Acb_NtkFindSupp_rec( p, iFanin, vSupp );
}